

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx512::
CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)2,_embree::avx512::CurveGeometryInterface,_embree::CatmullRomCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  uint uVar1;
  BufferView<embree::Vec3fx> *pBVar2;
  BufferView<embree::Vec3fa> *pBVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  size_t sVar7;
  char *pcVar8;
  size_t sVar9;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  float fVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined4 uVar62;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [32];
  undefined1 auVar66 [64];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  float fVar70;
  vfloat4 a0_2;
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [64];
  vfloat4 a0_1;
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  vfloat4 b0_2;
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [64];
  vfloat4 a0;
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  float fVar90;
  float fVar91;
  float fVar94;
  float fVar95;
  undefined1 auVar92 [16];
  undefined1 auVar93 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  Vec3fa n1;
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [32];
  float fVar104;
  vfloat4 b0_1;
  undefined1 auVar105 [16];
  undefined1 auVar106 [32];
  float fVar107;
  undefined1 auVar108 [16];
  float fVar111;
  float fVar112;
  undefined1 auVar109 [16];
  float fVar113;
  undefined1 auVar110 [32];
  float fVar114;
  float fVar115;
  float fVar117;
  float fVar118;
  float fVar119;
  undefined1 auVar116 [32];
  size_t local_b8;
  size_t local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar22 = r->_begin;
  if (uVar22 < r->_end) {
    local_a8._8_4_ = 0xff800000;
    local_a8._0_8_ = 0xff800000ff800000;
    local_a8._12_4_ = 0xff800000;
    local_98._8_4_ = 0x7f800000;
    local_98._0_8_ = 0x7f8000007f800000;
    local_98._12_4_ = 0x7f800000;
    local_b8 = 0;
    auVar78 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar66 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
    auVar86 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
    local_b0 = k;
    local_88 = local_98;
    local_78 = local_a8;
    do {
      pBVar2 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
               vertices.items;
      uVar1 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar22);
      uVar20 = (ulong)uVar1;
      uVar23 = (ulong)(uVar1 + 3);
      if (uVar23 < (pBVar2->super_RawBufferView).num) {
        uVar24 = (ulong)(uVar1 + 1);
        uVar25 = (ulong)(uVar1 + 2);
        fVar58 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        lVar21 = 0;
        do {
          lVar4 = *(long *)((long)&(pBVar2->super_RawBufferView).ptr_ofs + lVar21);
          lVar5 = *(long *)((long)&(pBVar2->super_RawBufferView).stride + lVar21);
          auVar26 = auVar78._0_16_;
          auVar27 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar20)),auVar26);
          if (1.844e+18 <= auVar27._0_4_) goto LAB_01f074c4;
          auVar27 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar24)),auVar26);
          if (1.844e+18 <= auVar27._0_4_) goto LAB_01f074c4;
          auVar27 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar25)),auVar26);
          if (1.844e+18 <= auVar27._0_4_) goto LAB_01f074c4;
          auVar27 = vandps_avx(ZEXT416(*(uint *)(lVar4 + 0xc + lVar5 * uVar23)),auVar26);
          if (1.844e+18 <= auVar27._0_4_) goto LAB_01f074c4;
          auVar27 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar20);
          auVar26 = auVar66._0_16_;
          uVar16 = vcmpps_avx512vl(auVar27,auVar26,6);
          auVar42 = auVar86._0_16_;
          uVar17 = vcmpps_avx512vl(auVar27,auVar42,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01f074c4;
          auVar38 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar24);
          uVar16 = vcmpps_avx512vl(auVar38,auVar26,6);
          uVar17 = vcmpps_avx512vl(auVar38,auVar42,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01f074c4;
          auVar39 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar25);
          uVar16 = vcmpps_avx512vl(auVar39,auVar26,6);
          uVar17 = vcmpps_avx512vl(auVar39,auVar42,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01f074c4;
          auVar37 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar23);
          uVar16 = vcmpps_avx512vl(auVar37,auVar26,6);
          uVar17 = vcmpps_avx512vl(auVar37,auVar42,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01f074c4;
          lVar4 = *(long *)((long)&(pBVar3->super_RawBufferView).ptr_ofs + lVar21);
          lVar5 = *(long *)((long)&(pBVar3->super_RawBufferView).stride + lVar21);
          auVar40 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar20);
          uVar16 = vcmpps_avx512vl(auVar40,auVar26,6);
          uVar17 = vcmpps_avx512vl(auVar40,auVar42,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01f074c4;
          auVar41 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar24);
          uVar16 = vcmpps_avx512vl(auVar41,auVar26,6);
          uVar17 = vcmpps_avx512vl(auVar41,auVar42,1);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) goto LAB_01f074c4;
          auVar26 = vshufps_avx(auVar27,auVar27,0xff);
          auVar26 = vmulss_avx512f(auVar26,ZEXT416((uint)fVar58));
          auVar42 = vinsertps_avx(auVar27,auVar26,0x30);
          auVar27 = vshufps_avx(auVar38,auVar38,0xff);
          auVar27 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar58));
          auVar38 = vinsertps_avx(auVar38,auVar27,0x30);
          auVar27 = vshufps_avx(auVar39,auVar39,0xff);
          auVar27 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar58));
          auVar39 = vinsertps_avx(auVar39,auVar27,0x30);
          auVar27 = vshufps_avx512vl(auVar37,auVar37,0xff);
          auVar27 = vmulss_avx512f(auVar27,ZEXT416((uint)fVar58));
          auVar37 = vinsertps_avx512f(auVar37,auVar27,0x30);
          auVar27 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar25);
          auVar26 = *(undefined1 (*) [16])(lVar4 + lVar5 * uVar23);
          auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
          auVar29 = vmulps_avx512vl(auVar37,auVar28);
          auVar30 = vfmadd213ps_avx512vl(ZEXT816(0) << 0x20,auVar39,auVar29);
          auVar31._0_4_ = auVar38._0_4_ + auVar30._0_4_;
          auVar31._4_4_ = auVar38._4_4_ + auVar30._4_4_;
          auVar31._8_4_ = auVar38._8_4_ + auVar30._8_4_;
          auVar31._12_4_ = auVar38._12_4_ + auVar30._12_4_;
          auVar31 = vfmadd231ps_avx512vl(auVar31,auVar42,auVar28);
          auVar59 = ZEXT816(0) << 0x40;
          auVar30._0_4_ = auVar37._0_4_ * 0.0;
          auVar30._4_4_ = auVar37._4_4_ * 0.0;
          auVar30._8_4_ = auVar37._8_4_ * 0.0;
          auVar30._12_4_ = auVar37._12_4_ * 0.0;
          auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar39,auVar32);
          auVar30 = vfmadd231ps_fma(auVar30,auVar38,auVar59);
          auVar33 = vfnmadd231ps_avx512vl(auVar30,auVar42,auVar32);
          auVar34 = vmulps_avx512vl(auVar26,auVar28);
          auVar30 = vfmadd213ps_fma(ZEXT816(0) << 0x40,auVar27,auVar34);
          auVar35._0_4_ = auVar41._0_4_ + auVar30._0_4_;
          auVar35._4_4_ = auVar41._4_4_ + auVar30._4_4_;
          auVar35._8_4_ = auVar41._8_4_ + auVar30._8_4_;
          auVar35._12_4_ = auVar41._12_4_ + auVar30._12_4_;
          auVar35 = vfmadd231ps_avx512vl(auVar35,auVar40,auVar28);
          auVar30 = vmulps_avx512vl(auVar26,auVar59);
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar27,auVar32);
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar41,auVar59);
          auVar36 = vfnmadd231ps_avx512vl(auVar30,auVar40,auVar32);
          auVar30 = vaddps_avx512vl(auVar39,auVar29);
          auVar30 = vfmadd231ps_avx512vl(auVar30,auVar38,auVar59);
          auVar29 = vfmadd231ps_avx512vl(auVar30,auVar42,auVar28);
          auVar37 = vmulps_avx512vl(auVar37,auVar32);
          auVar39 = vfmadd231ps_fma(auVar37,auVar59,auVar39);
          auVar38 = vfnmadd231ps_avx512vl(auVar39,auVar32,auVar38);
          auVar30 = vfmadd231ps_fma(auVar38,auVar59,auVar42);
          auVar42._0_4_ = auVar27._0_4_ + auVar34._0_4_;
          auVar42._4_4_ = auVar27._4_4_ + auVar34._4_4_;
          auVar42._8_4_ = auVar27._8_4_ + auVar34._8_4_;
          auVar42._12_4_ = auVar27._12_4_ + auVar34._12_4_;
          auVar42 = vfmadd231ps_fma(auVar42,auVar41,auVar59);
          auVar39 = vfmadd231ps_avx512vl(auVar42,auVar40,auVar28);
          auVar26 = vmulps_avx512vl(auVar26,auVar32);
          auVar27 = vfmadd231ps_fma(auVar26,auVar59,auVar27);
          auVar27 = vfnmadd231ps_avx512vl(auVar27,auVar32,auVar41);
          auVar37 = vfmadd231ps_avx512vl(auVar27,auVar59,auVar40);
          auVar27 = vshufps_avx(auVar33,auVar33,0xc9);
          auVar26 = vshufps_avx(auVar35,auVar35,0xc9);
          fVar12 = auVar33._0_4_;
          auVar105._0_4_ = auVar26._0_4_ * fVar12;
          fVar13 = auVar33._4_4_;
          auVar105._4_4_ = auVar26._4_4_ * fVar13;
          fVar14 = auVar33._8_4_;
          auVar105._8_4_ = auVar26._8_4_ * fVar14;
          fVar15 = auVar33._12_4_;
          auVar105._12_4_ = auVar26._12_4_ * fVar15;
          auVar26 = vfmsub231ps_fma(auVar105,auVar27,auVar35);
          auVar42 = vshufps_avx(auVar26,auVar26,0xc9);
          auVar26 = vshufps_avx512vl(auVar36,auVar36,0xc9);
          auVar38._0_4_ = auVar26._0_4_ * fVar12;
          auVar38._4_4_ = auVar26._4_4_ * fVar13;
          auVar38._8_4_ = auVar26._8_4_ * fVar14;
          auVar38._12_4_ = auVar26._12_4_ * fVar15;
          auVar27 = vfmsub231ps_avx512vl(auVar38,auVar27,auVar36);
          auVar38 = vshufps_avx(auVar27,auVar27,0xc9);
          auVar27 = vshufps_avx(auVar30,auVar30,0xc9);
          auVar26 = vshufps_avx(auVar39,auVar39,0xc9);
          fVar90 = auVar30._0_4_;
          auVar98._0_4_ = fVar90 * auVar26._0_4_;
          fVar94 = auVar30._4_4_;
          auVar98._4_4_ = fVar94 * auVar26._4_4_;
          fVar95 = auVar30._8_4_;
          auVar98._8_4_ = fVar95 * auVar26._8_4_;
          fVar107 = auVar30._12_4_;
          auVar98._12_4_ = fVar107 * auVar26._12_4_;
          auVar26 = vfmsub231ps_fma(auVar98,auVar27,auVar39);
          auVar39 = vshufps_avx(auVar26,auVar26,0xc9);
          auVar26 = vshufps_avx(auVar37,auVar37,0xc9);
          auVar40._0_4_ = fVar90 * auVar26._0_4_;
          auVar40._4_4_ = fVar94 * auVar26._4_4_;
          auVar40._8_4_ = fVar95 * auVar26._8_4_;
          auVar40._12_4_ = fVar107 * auVar26._12_4_;
          auVar27 = vfmsub231ps_fma(auVar40,auVar27,auVar37);
          auVar37 = vshufps_avx(auVar27,auVar27,0xc9);
          auVar27 = vdpps_avx(auVar42,auVar42,0x7f);
          auVar34._4_12_ = ZEXT812(0) << 0x20;
          auVar34._0_4_ = auVar27._0_4_;
          auVar26 = vrsqrt14ss_avx512f(auVar59,auVar34);
          auVar40 = vmulss_avx512f(auVar26,ZEXT416(0x3fc00000));
          auVar41 = vmulss_avx512f(auVar27,ZEXT416(0xbf000000));
          auVar41 = vmulss_avx512f(auVar41,auVar26);
          auVar26 = vmulss_avx512f(auVar41,ZEXT416((uint)(auVar26._0_4_ * auVar26._0_4_)));
          fVar70 = auVar40._0_4_ + auVar26._0_4_;
          auVar26 = vdpps_avx(auVar42,auVar38,0x7f);
          auVar109._4_4_ = fVar70;
          auVar109._0_4_ = fVar70;
          auVar109._8_4_ = fVar70;
          auVar109._12_4_ = fVar70;
          auVar40 = vmulps_avx512vl(auVar42,auVar109);
          auVar41 = vbroadcastss_avx512vl(auVar27);
          auVar38 = vmulps_avx512vl(auVar41,auVar38);
          fVar104 = auVar26._0_4_;
          auVar108._0_4_ = fVar104 * auVar42._0_4_;
          auVar108._4_4_ = fVar104 * auVar42._4_4_;
          auVar108._8_4_ = fVar104 * auVar42._8_4_;
          auVar108._12_4_ = fVar104 * auVar42._12_4_;
          auVar42 = vsubps_avx(auVar38,auVar108);
          auVar26 = vrcp14ss_avx512f(auVar59,auVar34);
          auVar27 = vfnmadd213ss_avx512f(auVar27,auVar26,ZEXT416(0x40000000));
          fVar115 = auVar26._0_4_ * auVar27._0_4_;
          auVar27 = vdpps_avx(auVar39,auVar39,0x7f);
          auVar36._4_12_ = ZEXT812(0) << 0x20;
          auVar36._0_4_ = auVar27._0_4_;
          auVar26 = vrsqrt14ss_avx512f(auVar59,auVar36);
          auVar38 = vmulss_avx512f(auVar26,ZEXT416(0x3fc00000));
          auVar41 = vmulss_avx512f(auVar27,ZEXT416(0xbf000000));
          fVar104 = auVar26._0_4_;
          fVar104 = auVar38._0_4_ + auVar41._0_4_ * fVar104 * fVar104 * fVar104;
          auVar26 = vdpps_avx(auVar39,auVar37,0x7f);
          fVar114 = auVar39._0_4_ * fVar104;
          fVar117 = auVar39._4_4_ * fVar104;
          fVar118 = auVar39._8_4_ * fVar104;
          fVar119 = auVar39._12_4_ * fVar104;
          auVar38 = vbroadcastss_avx512vl(auVar27);
          auVar38 = vmulps_avx512vl(auVar38,auVar37);
          fVar91 = auVar26._0_4_;
          auVar99._0_4_ = fVar91 * auVar39._0_4_;
          auVar99._4_4_ = fVar91 * auVar39._4_4_;
          auVar99._8_4_ = fVar91 * auVar39._8_4_;
          auVar99._12_4_ = fVar91 * auVar39._12_4_;
          auVar38 = vsubps_avx(auVar38,auVar99);
          auVar26 = vrcp14ss_avx512f(auVar59,auVar36);
          auVar27 = vfnmadd213ss_avx512f(auVar27,auVar26,ZEXT416(0x40000000));
          fVar91 = auVar26._0_4_ * auVar27._0_4_;
          auVar27 = vshufps_avx(auVar31,auVar31,0xff);
          auVar37 = vmulps_avx512vl(auVar27,auVar40);
          auVar39 = vsubps_avx(auVar31,auVar37);
          auVar26 = vshufps_avx(auVar33,auVar33,0xff);
          auVar26 = vmulps_avx512vl(auVar26,auVar40);
          auVar28._0_4_ = auVar26._0_4_ + auVar27._0_4_ * fVar70 * auVar42._0_4_ * fVar115;
          auVar28._4_4_ = auVar26._4_4_ + auVar27._4_4_ * fVar70 * auVar42._4_4_ * fVar115;
          auVar28._8_4_ = auVar26._8_4_ + auVar27._8_4_ * fVar70 * auVar42._8_4_ * fVar115;
          auVar28._12_4_ = auVar26._12_4_ + auVar27._12_4_ * fVar70 * auVar42._12_4_ * fVar115;
          auVar26 = vsubps_avx(auVar33,auVar28);
          auVar37 = vaddps_avx512vl(auVar31,auVar37);
          auVar42 = vshufps_avx512vl(auVar29,auVar29,0xff);
          auVar32._0_4_ = fVar114 * auVar42._0_4_;
          auVar32._4_4_ = fVar117 * auVar42._4_4_;
          auVar32._8_4_ = fVar118 * auVar42._8_4_;
          auVar32._12_4_ = fVar119 * auVar42._12_4_;
          auVar40 = vsubps_avx512vl(auVar29,auVar32);
          auVar27 = vshufps_avx(auVar30,auVar30,0xff);
          auVar41._0_4_ = auVar27._0_4_ * fVar114 + auVar42._0_4_ * fVar104 * auVar38._0_4_ * fVar91
          ;
          auVar41._4_4_ = auVar27._4_4_ * fVar117 + auVar42._4_4_ * fVar104 * auVar38._4_4_ * fVar91
          ;
          auVar41._8_4_ = auVar27._8_4_ * fVar118 + auVar42._8_4_ * fVar104 * auVar38._8_4_ * fVar91
          ;
          auVar41._12_4_ =
               auVar27._12_4_ * fVar119 + auVar42._12_4_ * fVar104 * auVar38._12_4_ * fVar91;
          auVar27 = vsubps_avx(auVar30,auVar41);
          auVar38 = vaddps_avx512vl(auVar29,auVar32);
          fVar104 = auVar39._0_4_;
          fVar70 = fVar104 + auVar26._0_4_ * 0.33333334;
          auVar29._0_4_ = auVar27._0_4_ * 0.33333334;
          auVar29._4_4_ = auVar27._4_4_ * 0.33333334;
          auVar29._8_4_ = auVar27._8_4_ * 0.33333334;
          auVar29._12_4_ = auVar27._12_4_ * 0.33333334;
          auVar27 = vsubps_avx(auVar40,auVar29);
          auVar55._4_4_ = fVar104;
          auVar55._0_4_ = fVar104;
          auVar55._8_4_ = fVar104;
          auVar55._12_4_ = fVar104;
          auVar55._16_4_ = fVar104;
          auVar55._20_4_ = fVar104;
          auVar55._24_4_ = fVar104;
          auVar55._28_4_ = fVar104;
          auVar96._8_4_ = 1;
          auVar96._0_8_ = 0x100000001;
          auVar96._12_4_ = 1;
          auVar96._16_4_ = 1;
          auVar96._20_4_ = 1;
          auVar96._24_4_ = 1;
          auVar96._28_4_ = 1;
          auVar54 = vpermps_avx2(auVar96,ZEXT1632(auVar39));
          auVar43 = vbroadcastss_avx512vl(ZEXT416(2));
          auVar44 = vpermps_avx512vl(auVar43,ZEXT1632(auVar39));
          auVar110._4_4_ = fVar70;
          auVar110._0_4_ = fVar70;
          auVar110._8_4_ = fVar70;
          auVar110._12_4_ = fVar70;
          auVar110._16_4_ = fVar70;
          auVar110._20_4_ = fVar70;
          auVar110._24_4_ = fVar70;
          auVar110._28_4_ = fVar70;
          auVar52 = ZEXT1632(CONCAT412(auVar39._12_4_ + auVar26._12_4_ * 0.33333334,
                                       CONCAT48(auVar39._8_4_ + auVar26._8_4_ * 0.33333334,
                                                CONCAT44(auVar39._4_4_ + auVar26._4_4_ * 0.33333334,
                                                         fVar70))));
          auVar53 = vpermps_avx2(auVar96,auVar52);
          auVar45 = vpermps_avx512vl(auVar43,auVar52);
          auVar46 = vbroadcastss_avx512vl(auVar27);
          auVar47 = vpermps_avx512vl(auVar96,ZEXT1632(auVar27));
          auVar48 = vpermps_avx512vl(auVar43,ZEXT1632(auVar27));
          auVar49 = vbroadcastss_avx512vl(auVar40);
          auVar52 = vpermps_avx2(auVar96,ZEXT1632(auVar40));
          auVar50 = vpermps_avx512vl(auVar43,ZEXT1632(auVar40));
          auVar51 = vmulps_avx512vl(auVar49,bezier_basis0._3944_32_);
          auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._2788_32_,auVar46);
          auVar49 = vmulps_avx512vl(auVar49,bezier_basis0._8568_32_);
          auVar46 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._7412_32_,auVar46);
          auVar49 = vmulps_avx512vl(auVar52,bezier_basis0._3944_32_);
          auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._2788_32_,auVar47);
          auVar52 = vmulps_avx512vl(auVar52,bezier_basis0._8568_32_);
          auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._7412_32_,auVar47);
          auVar47 = vmulps_avx512vl(auVar50,bezier_basis0._3944_32_);
          auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._2788_32_,auVar48);
          auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._1632_32_,auVar110);
          auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._1632_32_,auVar53);
          auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._1632_32_,auVar45);
          auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._476_32_,auVar55);
          auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar54);
          auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._476_32_,auVar44);
          auVar50 = vmulps_avx512vl(auVar50,bezier_basis0._8568_32_);
          auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._7412_32_,auVar48);
          auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar110);
          auVar53 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._6256_32_,auVar53);
          auVar52 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._6256_32_,auVar45);
          auVar45 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._5100_32_,auVar55);
          auVar54 = vfmadd231ps_avx512vl(auVar53,bezier_basis0._5100_32_,auVar54);
          auVar53 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._5100_32_,auVar44);
          auVar68._8_4_ = 0x3d638e39;
          auVar68._0_8_ = 0x3d638e393d638e39;
          auVar68._12_4_ = 0x3d638e39;
          auVar68._16_4_ = 0x3d638e39;
          auVar68._20_4_ = 0x3d638e39;
          auVar68._24_4_ = 0x3d638e39;
          auVar68._28_4_ = 0x3d638e39;
          auVar50 = vmulps_avx512vl(auVar45,auVar68);
          auVar45._4_4_ = auVar54._4_4_ * 0.055555556;
          auVar45._0_4_ = auVar54._0_4_ * 0.055555556;
          auVar45._8_4_ = auVar54._8_4_ * 0.055555556;
          auVar45._12_4_ = auVar54._12_4_ * 0.055555556;
          auVar45._16_4_ = auVar54._16_4_ * 0.055555556;
          auVar45._20_4_ = auVar54._20_4_ * 0.055555556;
          auVar45._24_4_ = auVar54._24_4_ * 0.055555556;
          auVar45._28_4_ = auVar48._28_4_;
          auVar46._4_4_ = auVar53._4_4_ * 0.055555556;
          auVar46._0_4_ = auVar53._0_4_ * 0.055555556;
          auVar46._8_4_ = auVar53._8_4_ * 0.055555556;
          auVar46._12_4_ = auVar53._12_4_ * 0.055555556;
          auVar46._16_4_ = auVar53._16_4_ * 0.055555556;
          auVar46._20_4_ = auVar53._20_4_ * 0.055555556;
          auVar46._24_4_ = auVar53._24_4_ * 0.055555556;
          auVar46._28_4_ = auVar54._28_4_;
          auVar54 = vblendps_avx(auVar50,ZEXT832(0) << 0x20,1);
          auVar53 = vblendps_avx(auVar45,ZEXT832(0) << 0x20,1);
          auVar56 = ZEXT832(0) << 0x20;
          auVar52 = vblendps_avx(auVar46,auVar56,1);
          auVar44 = vsubps_avx(auVar51,auVar54);
          auVar48 = vsubps_avx512vl(auVar49,auVar53);
          auVar55 = vsubps_avx512vl(auVar47,auVar52);
          auVar54 = vblendps_avx(auVar50,auVar56,0x80);
          auVar53 = vblendps_avx(auVar45,auVar56,0x80);
          auVar52 = vblendps_avx(auVar46,auVar56,0x80);
          auVar76._0_4_ = auVar51._0_4_ + auVar54._0_4_;
          auVar76._4_4_ = auVar51._4_4_ + auVar54._4_4_;
          auVar76._8_4_ = auVar51._8_4_ + auVar54._8_4_;
          auVar76._12_4_ = auVar51._12_4_ + auVar54._12_4_;
          auVar76._16_4_ = auVar51._16_4_ + auVar54._16_4_;
          auVar76._20_4_ = auVar51._20_4_ + auVar54._20_4_;
          auVar76._24_4_ = auVar51._24_4_ + auVar54._24_4_;
          auVar76._28_4_ = auVar51._28_4_ + auVar54._28_4_;
          auVar45 = vaddps_avx512vl(auVar49,auVar53);
          auVar52 = vaddps_avx512vl(auVar47,auVar52);
          auVar50 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
          auVar54 = vminps_avx512vl(auVar50,auVar51);
          auVar53 = vminps_avx512vl(auVar50,auVar49);
          auVar46 = vminps_avx512vl(auVar50,auVar47);
          auVar56 = vminps_avx512vl(auVar44,auVar76);
          auVar56 = vminps_avx512vl(auVar54,auVar56);
          auVar54 = vminps_avx512vl(auVar48,auVar45);
          auVar57 = vminps_avx512vl(auVar53,auVar54);
          auVar54 = vminps_avx512vl(auVar55,auVar52);
          auVar46 = vminps_avx512vl(auVar46,auVar54);
          auVar54 = vmaxps_avx(auVar44,auVar76);
          auVar27._0_4_ = (fVar12 + auVar28._0_4_) * 0.33333334;
          auVar27._4_4_ = (fVar13 + auVar28._4_4_) * 0.33333334;
          auVar27._8_4_ = (fVar14 + auVar28._8_4_) * 0.33333334;
          auVar27._12_4_ = (fVar15 + auVar28._12_4_) * 0.33333334;
          auVar39 = vaddps_avx512vl(auVar37,auVar27);
          auVar26._0_4_ = (fVar90 + auVar41._0_4_) * 0.33333334;
          auVar26._4_4_ = (fVar94 + auVar41._4_4_) * 0.33333334;
          auVar26._8_4_ = (fVar95 + auVar41._8_4_) * 0.33333334;
          auVar26._12_4_ = (fVar107 + auVar41._12_4_) * 0.33333334;
          auVar40 = vsubps_avx512vl(auVar38,auVar26);
          auVar84._8_4_ = 0xff800000;
          auVar84._0_8_ = 0xff800000ff800000;
          auVar84._12_4_ = 0xff800000;
          auVar84._16_4_ = 0xff800000;
          auVar84._20_4_ = 0xff800000;
          auVar84._24_4_ = 0xff800000;
          auVar84._28_4_ = 0xff800000;
          auVar53 = vmaxps_avx(auVar84,auVar51);
          auVar44 = vmaxps_avx512vl(auVar84,auVar49);
          auVar47 = vmaxps_avx512vl(auVar84,auVar47);
          auVar54 = vmaxps_avx(auVar53,auVar54);
          auVar53 = vmaxps_avx(auVar48,auVar45);
          auVar53 = vmaxps_avx(auVar44,auVar53);
          auVar52 = vmaxps_avx(auVar55,auVar52);
          auVar52 = vmaxps_avx(auVar47,auVar52);
          auVar44 = vshufps_avx(auVar56,auVar56,0xb1);
          auVar44 = vminps_avx(auVar56,auVar44);
          auVar45 = vshufpd_avx(auVar44,auVar44,5);
          auVar44 = vminps_avx(auVar44,auVar45);
          auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
          auVar44 = vshufps_avx(auVar57,auVar57,0xb1);
          auVar44 = vminps_avx(auVar57,auVar44);
          auVar45 = vshufpd_avx(auVar44,auVar44,5);
          auVar44 = vminps_avx(auVar44,auVar45);
          auVar26 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
          auVar26 = vunpcklps_avx(auVar27,auVar26);
          auVar44 = vshufps_avx(auVar46,auVar46,0xb1);
          auVar44 = vminps_avx(auVar46,auVar44);
          auVar45 = vshufpd_avx(auVar44,auVar44,5);
          auVar44 = vminps_avx(auVar44,auVar45);
          auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
          auVar27 = vinsertps_avx(auVar26,auVar27,0x28);
          auVar44 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar44);
          auVar44 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar44);
          auVar26 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar54 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar54 = vmaxps_avx(auVar53,auVar54);
          auVar53 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar53);
          auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar42 = vunpcklps_avx(auVar26,auVar42);
          auVar54 = vshufps_avx(auVar52,auVar52,0xb1);
          auVar54 = vmaxps_avx(auVar52,auVar54);
          auVar53 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar53);
          auVar26 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar26 = vinsertps_avx(auVar42,auVar26,0x28);
          auVar53 = vbroadcastss_avx512vl(auVar37);
          auVar52 = vpermps_avx512vl(auVar96,ZEXT1632(auVar37));
          auVar44 = vpermps_avx512vl(auVar43,ZEXT1632(auVar37));
          uVar62 = auVar39._0_4_;
          auVar103._4_4_ = uVar62;
          auVar103._0_4_ = uVar62;
          auVar103._8_4_ = uVar62;
          auVar103._12_4_ = uVar62;
          auVar103._16_4_ = uVar62;
          auVar103._20_4_ = uVar62;
          auVar103._24_4_ = uVar62;
          auVar103._28_4_ = uVar62;
          auVar54 = vpermps_avx2(auVar96,ZEXT1632(auVar39));
          auVar45 = vpermps_avx512vl(auVar43,ZEXT1632(auVar39));
          auVar46 = vbroadcastss_avx512vl(auVar40);
          auVar47 = vpermps_avx512vl(auVar96,ZEXT1632(auVar40));
          auVar48 = vpermps_avx512vl(auVar43,ZEXT1632(auVar40));
          auVar49 = vbroadcastss_avx512vl(auVar38);
          auVar51 = vpermps_avx512vl(auVar96,ZEXT1632(auVar38));
          auVar43 = vpermps_avx512vl(auVar43,ZEXT1632(auVar38));
          auVar55 = vmulps_avx512vl(auVar49,bezier_basis0._3944_32_);
          auVar55 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._2788_32_,auVar46);
          auVar49 = vmulps_avx512vl(auVar49,bezier_basis0._8568_32_);
          auVar46 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._7412_32_,auVar46);
          auVar49 = vmulps_avx512vl(auVar51,bezier_basis0._3944_32_);
          auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._2788_32_,auVar47);
          auVar51 = vmulps_avx512vl(auVar51,bezier_basis0._8568_32_);
          auVar47 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._7412_32_,auVar47);
          auVar51 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
          auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._2788_32_,auVar48);
          auVar55 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._1632_32_,auVar103);
          auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._1632_32_,auVar54);
          auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._1632_32_,auVar45);
          auVar55 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._476_32_,auVar53);
          auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar52);
          auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._476_32_,auVar44);
          auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
          auVar43 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar48);
          auVar46 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar103);
          auVar54 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._6256_32_,auVar54);
          auVar45 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._6256_32_,auVar45);
          auVar53 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._5100_32_,auVar53);
          auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._5100_32_,auVar52);
          auVar52 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._5100_32_,auVar44);
          auVar43 = vmulps_avx512vl(auVar53,auVar68);
          auVar47 = vmulps_avx512vl(auVar54,auVar68);
          auVar48 = vmulps_avx512vl(auVar52,auVar68);
          auVar56 = ZEXT832(0) << 0x20;
          auVar54 = vblendps_avx(auVar43,auVar56,1);
          auVar53 = vblendps_avx(auVar47,auVar56,1);
          auVar52 = vblendps_avx(auVar48,auVar56,1);
          auVar44 = vsubps_avx(auVar55,auVar54);
          auVar45 = vsubps_avx(auVar49,auVar53);
          auVar46 = vsubps_avx(auVar51,auVar52);
          auVar54 = vblendps_avx(auVar43,auVar56,0x80);
          auVar53 = vblendps_avx(auVar47,auVar56,0x80);
          auVar52 = vblendps_avx(auVar48,auVar56,0x80);
          auVar56._0_4_ = auVar55._0_4_ + auVar54._0_4_;
          auVar56._4_4_ = auVar55._4_4_ + auVar54._4_4_;
          auVar56._8_4_ = auVar55._8_4_ + auVar54._8_4_;
          auVar56._12_4_ = auVar55._12_4_ + auVar54._12_4_;
          auVar56._16_4_ = auVar55._16_4_ + auVar54._16_4_;
          auVar56._20_4_ = auVar55._20_4_ + auVar54._20_4_;
          auVar56._24_4_ = auVar55._24_4_ + auVar54._24_4_;
          auVar56._28_4_ = auVar55._28_4_ + auVar54._28_4_;
          auVar57._0_4_ = auVar49._0_4_ + auVar53._0_4_;
          auVar57._4_4_ = auVar49._4_4_ + auVar53._4_4_;
          auVar57._8_4_ = auVar49._8_4_ + auVar53._8_4_;
          auVar57._12_4_ = auVar49._12_4_ + auVar53._12_4_;
          auVar57._16_4_ = auVar49._16_4_ + auVar53._16_4_;
          auVar57._20_4_ = auVar49._20_4_ + auVar53._20_4_;
          auVar57._24_4_ = auVar49._24_4_ + auVar53._24_4_;
          auVar57._28_4_ = auVar49._28_4_ + auVar53._28_4_;
          auVar82._0_4_ = auVar51._0_4_ + auVar52._0_4_;
          auVar82._4_4_ = auVar51._4_4_ + auVar52._4_4_;
          auVar82._8_4_ = auVar51._8_4_ + auVar52._8_4_;
          auVar82._12_4_ = auVar51._12_4_ + auVar52._12_4_;
          auVar82._16_4_ = auVar51._16_4_ + auVar52._16_4_;
          auVar82._20_4_ = auVar51._20_4_ + auVar52._20_4_;
          auVar82._24_4_ = auVar51._24_4_ + auVar52._24_4_;
          auVar82._28_4_ = auVar51._28_4_ + auVar52._28_4_;
          auVar54 = vminps_avx512vl(auVar50,auVar55);
          auVar53 = vminps_avx512vl(auVar50,auVar49);
          auVar52 = vminps_avx512vl(auVar50,auVar51);
          auVar43 = vminps_avx512vl(auVar44,auVar56);
          auVar43 = vminps_avx512vl(auVar54,auVar43);
          auVar54 = vminps_avx512vl(auVar45,auVar57);
          auVar47 = vminps_avx512vl(auVar53,auVar54);
          auVar54 = vminps_avx512vl(auVar46,auVar82);
          auVar48 = vminps_avx512vl(auVar52,auVar54);
          auVar54 = vmaxps_avx(auVar44,auVar56);
          auVar53 = vmaxps_avx(auVar84,auVar55);
          auVar54 = vmaxps_avx(auVar53,auVar54);
          auVar53 = vmaxps_avx(auVar45,auVar57);
          auVar52 = vmaxps_avx(auVar84,auVar49);
          auVar53 = vmaxps_avx(auVar52,auVar53);
          auVar52 = vmaxps_avx(auVar46,auVar82);
          auVar44 = vmaxps_avx(auVar84,auVar51);
          auVar52 = vmaxps_avx(auVar44,auVar52);
          auVar44 = vshufps_avx(auVar43,auVar43,0xb1);
          auVar44 = vminps_avx(auVar43,auVar44);
          auVar45 = vshufpd_avx(auVar44,auVar44,5);
          auVar44 = vminps_avx(auVar44,auVar45);
          auVar42 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
          auVar44 = vshufps_avx512vl(auVar47,auVar47,0xb1);
          auVar45 = vminps_avx512vl(auVar47,auVar44);
          auVar44 = vshufpd_avx(auVar45,auVar45,5);
          auVar44 = vminps_avx(auVar45,auVar44);
          auVar38 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
          auVar38 = vunpcklps_avx(auVar42,auVar38);
          auVar44 = vshufps_avx512vl(auVar48,auVar48,0xb1);
          auVar45 = vminps_avx512vl(auVar48,auVar44);
          auVar44 = vshufpd_avx(auVar45,auVar45,5);
          auVar44 = vminps_avx(auVar45,auVar44);
          auVar42 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
          auVar42 = vinsertps_avx(auVar38,auVar42,0x28);
          auVar38 = vminps_avx(auVar27,auVar42);
          auVar44 = vshufps_avx(auVar54,auVar54,0xb1);
          auVar54 = vmaxps_avx(auVar54,auVar44);
          auVar44 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar44);
          auVar27 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar54 = vshufps_avx(auVar53,auVar53,0xb1);
          auVar54 = vmaxps_avx(auVar53,auVar54);
          auVar53 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar53);
          auVar42 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar37._8_4_ = 0x5dccb9a2;
          auVar37._0_8_ = 0x5dccb9a25dccb9a2;
          auVar37._12_4_ = 0x5dccb9a2;
          auVar86 = ZEXT1664(auVar37);
          auVar42 = vunpcklps_avx(auVar27,auVar42);
          auVar54 = vshufps_avx(auVar52,auVar52,0xb1);
          auVar54 = vmaxps_avx(auVar52,auVar54);
          auVar53 = vshufpd_avx(auVar54,auVar54,5);
          auVar54 = vmaxps_avx(auVar54,auVar53);
          auVar27 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
          auVar39._8_4_ = 0xddccb9a2;
          auVar39._0_8_ = 0xddccb9a2ddccb9a2;
          auVar39._12_4_ = 0xddccb9a2;
          auVar66 = ZEXT1664(auVar39);
          auVar27 = vinsertps_avx(auVar42,auVar27,0x28);
          auVar27 = vmaxps_avx(auVar26,auVar27);
          uVar16 = vcmpps_avx512vl(auVar27,auVar37,1);
          uVar17 = vcmpps_avx512vl(auVar38,auVar39,6);
          if ((~((ushort)uVar16 & (ushort)uVar17) & 7) != 0) {
            auVar78 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
            goto LAB_01f074c4;
          }
          lVar21 = lVar21 + 0x38;
          auVar78 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        } while ((ulong)((this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar21);
        pcVar6 = (pBVar2->super_RawBufferView).ptr_ofs;
        sVar7 = (pBVar2->super_RawBufferView).stride;
        fVar58 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 maxRadiusScale;
        auVar39 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar20),
                                ZEXT416((uint)(fVar58 * *(float *)(pcVar6 + sVar7 * uVar20 + 0xc))),
                                0x30);
        auVar37 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar24),
                                ZEXT416((uint)(fVar58 * *(float *)(pcVar6 + sVar7 * uVar24 + 0xc))),
                                0x30);
        auVar40 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar25),
                                ZEXT416((uint)(fVar58 * *(float *)(pcVar6 + sVar7 * uVar25 + 0xc))),
                                0x30);
        pBVar3 = (this->super_CurveGeometryInterface<embree::CatmullRomCurveT>).super_CurveGeometry.
                 normals.items;
        pcVar8 = (pBVar3->super_RawBufferView).ptr_ofs;
        sVar9 = (pBVar3->super_RawBufferView).stride;
        auVar27 = *(undefined1 (*) [16])(pcVar8 + uVar20 * sVar9);
        auVar26 = *(undefined1 (*) [16])(pcVar8 + uVar24 * sVar9);
        auVar42 = *(undefined1 (*) [16])(pcVar8 + uVar25 * sVar9);
        auVar41 = vinsertps_avx(*(undefined1 (*) [16])(pcVar6 + sVar7 * uVar23),
                                ZEXT416((uint)(fVar58 * *(float *)(pcVar6 + sVar7 * uVar23 + 0xc))),
                                0x30);
        auVar38 = *(undefined1 (*) [16])(pcVar8 + sVar9 * uVar23);
        auVar28 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar29 = vmulps_avx512vl(auVar41,auVar28);
        auVar30 = vfmadd213ps_fma(ZEXT816(0),auVar40,auVar29);
        auVar59._0_4_ = auVar37._0_4_ + auVar30._0_4_;
        auVar59._4_4_ = auVar37._4_4_ + auVar30._4_4_;
        auVar59._8_4_ = auVar37._8_4_ + auVar30._8_4_;
        auVar59._12_4_ = auVar37._12_4_ + auVar30._12_4_;
        auVar31 = vfmadd231ps_avx512vl(auVar59,auVar39,auVar28);
        auVar36 = ZEXT816(0);
        auVar63._0_4_ = auVar41._0_4_ * 0.0;
        auVar63._4_4_ = auVar41._4_4_ * 0.0;
        auVar63._8_4_ = auVar41._8_4_ * 0.0;
        auVar63._12_4_ = auVar41._12_4_ * 0.0;
        auVar32 = vbroadcastss_avx512vl(ZEXT416(0x3f000000));
        auVar30 = vfmadd231ps_avx512vl(auVar63,auVar40,auVar32);
        auVar30 = vfmadd231ps_fma(auVar30,auVar37,auVar36);
        auVar30 = vfnmadd231ps_avx512vl(auVar30,auVar39,auVar32);
        auVar33 = vmulps_avx512vl(auVar38,auVar28);
        auVar34 = vxorps_avx512vl(auVar47._0_16_,auVar47._0_16_);
        auVar34 = vfmadd213ps_avx512vl(auVar34,auVar42,auVar33);
        auVar34 = vaddps_avx512vl(auVar26,auVar34);
        auVar34 = vfmadd231ps_avx512vl(auVar34,auVar27,auVar28);
        auVar35 = vmulps_avx512vl(auVar38,auVar36);
        auVar35 = vfmadd231ps_avx512vl(auVar35,auVar42,auVar32);
        auVar35 = vfmadd231ps_avx512vl(auVar35,auVar26,auVar36);
        auVar35 = vfnmadd231ps_avx512vl(auVar35,auVar27,auVar32);
        auVar29 = vaddps_avx512vl(auVar40,auVar29);
        auVar29 = vfmadd231ps_avx512vl(auVar29,auVar37,auVar36);
        auVar29 = vfmadd231ps_avx512vl(auVar29,auVar39,auVar28);
        auVar41 = vmulps_avx512vl(auVar41,auVar32);
        auVar40 = vfmadd231ps_fma(auVar41,auVar36,auVar40);
        auVar37 = vfnmadd231ps_avx512vl(auVar40,auVar32,auVar37);
        auVar40 = vfmadd231ps_fma(auVar37,auVar36,auVar39);
        auVar71._0_4_ = auVar42._0_4_ + auVar33._0_4_;
        auVar71._4_4_ = auVar42._4_4_ + auVar33._4_4_;
        auVar71._8_4_ = auVar42._8_4_ + auVar33._8_4_;
        auVar71._12_4_ = auVar42._12_4_ + auVar33._12_4_;
        auVar39 = vfmadd231ps_fma(auVar71,auVar26,auVar36);
        auVar39 = vfmadd231ps_avx512vl(auVar39,auVar27,auVar28);
        auVar38 = vmulps_avx512vl(auVar38,auVar32);
        auVar42 = vfmadd231ps_fma(auVar38,auVar36,auVar42);
        auVar26 = vfnmadd231ps_avx512vl(auVar42,auVar32,auVar26);
        auVar37 = vfmadd231ps_fma(auVar26,auVar36,auVar27);
        auVar27 = vshufps_avx(auVar30,auVar30,0xc9);
        auVar26 = vshufps_avx512vl(auVar34,auVar34,0xc9);
        fVar104 = auVar30._0_4_;
        auVar87._0_4_ = auVar26._0_4_ * fVar104;
        fVar12 = auVar30._4_4_;
        auVar87._4_4_ = auVar26._4_4_ * fVar12;
        fVar13 = auVar30._8_4_;
        auVar87._8_4_ = auVar26._8_4_ * fVar13;
        fVar14 = auVar30._12_4_;
        auVar87._12_4_ = auVar26._12_4_ * fVar14;
        auVar26 = vfmsub231ps_avx512vl(auVar87,auVar27,auVar34);
        auVar42 = vshufps_avx(auVar26,auVar26,0xc9);
        auVar26 = vshufps_avx512vl(auVar35,auVar35,0xc9);
        auVar100._0_4_ = auVar26._0_4_ * fVar104;
        auVar100._4_4_ = auVar26._4_4_ * fVar12;
        auVar100._8_4_ = auVar26._8_4_ * fVar13;
        auVar100._12_4_ = auVar26._12_4_ * fVar14;
        auVar27 = vfmsub231ps_avx512vl(auVar100,auVar27,auVar35);
        auVar38 = vshufps_avx(auVar27,auVar27,0xc9);
        auVar27 = vshufps_avx(auVar40,auVar40,0xc9);
        auVar26 = vshufps_avx(auVar39,auVar39,0xc9);
        fVar91 = auVar40._0_4_;
        auVar101._0_4_ = fVar91 * auVar26._0_4_;
        fVar90 = auVar40._4_4_;
        auVar101._4_4_ = fVar90 * auVar26._4_4_;
        fVar94 = auVar40._8_4_;
        auVar101._8_4_ = fVar94 * auVar26._8_4_;
        fVar95 = auVar40._12_4_;
        auVar101._12_4_ = fVar95 * auVar26._12_4_;
        auVar26 = vfmsub231ps_fma(auVar101,auVar27,auVar39);
        auVar39 = vshufps_avx(auVar26,auVar26,0xc9);
        auVar26 = vshufps_avx(auVar37,auVar37,0xc9);
        auVar72._0_4_ = fVar91 * auVar26._0_4_;
        auVar72._4_4_ = fVar90 * auVar26._4_4_;
        auVar72._8_4_ = fVar94 * auVar26._8_4_;
        auVar72._12_4_ = fVar95 * auVar26._12_4_;
        auVar27 = vfmsub231ps_fma(auVar72,auVar27,auVar37);
        auVar37 = vshufps_avx(auVar27,auVar27,0xc9);
        auVar27 = vdpps_avx(auVar42,auVar42,0x7f);
        auVar26 = vrsqrt14ss_avx512f(auVar36,ZEXT416(auVar27._0_4_));
        auVar41 = vmulss_avx512f(auVar26,ZEXT416(0x3fc00000));
        auVar28 = vmulss_avx512f(auVar27,ZEXT416(0xbf000000));
        fVar58 = auVar26._0_4_;
        fVar58 = auVar41._0_4_ + auVar28._0_4_ * fVar58 * fVar58 * fVar58;
        fVar119 = auVar42._0_4_ * fVar58;
        fVar111 = auVar42._4_4_ * fVar58;
        fVar112 = auVar42._8_4_ * fVar58;
        fVar113 = auVar42._12_4_ * fVar58;
        auVar26 = vdpps_avx(auVar42,auVar38,0x7f);
        auVar41 = vbroadcastss_avx512vl(auVar27);
        auVar38 = vmulps_avx512vl(auVar41,auVar38);
        fVar70 = auVar26._0_4_;
        auVar88._0_4_ = fVar70 * auVar42._0_4_;
        auVar88._4_4_ = fVar70 * auVar42._4_4_;
        auVar88._8_4_ = fVar70 * auVar42._8_4_;
        auVar88._12_4_ = fVar70 * auVar42._12_4_;
        auVar42 = vsubps_avx(auVar38,auVar88);
        auVar26 = vrcp14ss_avx512f(auVar36,ZEXT416(auVar27._0_4_));
        auVar27 = vfnmadd213ss_avx512f(auVar27,auVar26,ZEXT416(0x40000000));
        fVar15 = auVar26._0_4_ * auVar27._0_4_;
        auVar27 = vdpps_avx(auVar39,auVar39,0x7f);
        auVar26 = vrsqrt14ss_avx512f(auVar36,ZEXT416(auVar27._0_4_));
        auVar38 = vmulss_avx512f(auVar26,ZEXT416(0x3fc00000));
        auVar41 = vmulss_avx512f(auVar27,ZEXT416(0xbf000000));
        fVar70 = auVar26._0_4_;
        fVar70 = auVar38._0_4_ + auVar41._0_4_ * fVar70 * fVar70 * fVar70;
        fVar107 = auVar39._0_4_ * fVar70;
        fVar114 = auVar39._4_4_ * fVar70;
        fVar117 = auVar39._8_4_ * fVar70;
        fVar118 = auVar39._12_4_ * fVar70;
        auVar26 = vdpps_avx(auVar39,auVar37,0x7f);
        auVar38 = vbroadcastss_avx512vl(auVar27);
        auVar38 = vmulps_avx512vl(auVar38,auVar37);
        fVar115 = auVar26._0_4_;
        auVar102._0_4_ = fVar115 * auVar39._0_4_;
        auVar102._4_4_ = fVar115 * auVar39._4_4_;
        auVar102._8_4_ = fVar115 * auVar39._8_4_;
        auVar102._12_4_ = fVar115 * auVar39._12_4_;
        auVar38 = vsubps_avx(auVar38,auVar102);
        auVar26 = vrcp14ss_avx512f(auVar36,ZEXT416(auVar27._0_4_));
        auVar27 = vfnmadd213ss_avx512f(auVar27,auVar26,ZEXT416(0x40000000));
        fVar115 = auVar26._0_4_ * auVar27._0_4_;
        auVar27 = vshufps_avx(auVar31,auVar31,0xff);
        auVar89._0_4_ = fVar119 * auVar27._0_4_;
        auVar89._4_4_ = fVar111 * auVar27._4_4_;
        auVar89._8_4_ = fVar112 * auVar27._8_4_;
        auVar89._12_4_ = fVar113 * auVar27._12_4_;
        auVar39 = vsubps_avx(auVar31,auVar89);
        auVar26 = vshufps_avx(auVar30,auVar30,0xff);
        auVar73._0_4_ = auVar26._0_4_ * fVar119 + auVar27._0_4_ * fVar58 * fVar15 * auVar42._0_4_;
        auVar73._4_4_ = auVar26._4_4_ * fVar111 + auVar27._4_4_ * fVar58 * fVar15 * auVar42._4_4_;
        auVar73._8_4_ = auVar26._8_4_ * fVar112 + auVar27._8_4_ * fVar58 * fVar15 * auVar42._8_4_;
        auVar73._12_4_ =
             auVar26._12_4_ * fVar113 + auVar27._12_4_ * fVar58 * fVar15 * auVar42._12_4_;
        auVar26 = vsubps_avx(auVar30,auVar73);
        auVar37 = vaddps_avx512vl(auVar31,auVar89);
        auVar42 = vshufps_avx512vl(auVar29,auVar29,0xff);
        auVar64._0_4_ = fVar107 * auVar42._0_4_;
        auVar64._4_4_ = fVar114 * auVar42._4_4_;
        auVar64._8_4_ = fVar117 * auVar42._8_4_;
        auVar64._12_4_ = fVar118 * auVar42._12_4_;
        auVar41 = vsubps_avx512vl(auVar29,auVar64);
        auVar27 = vshufps_avx(auVar40,auVar40,0xff);
        auVar60._0_4_ = auVar27._0_4_ * fVar107 + auVar42._0_4_ * fVar70 * auVar38._0_4_ * fVar115;
        auVar60._4_4_ = auVar27._4_4_ * fVar114 + auVar42._4_4_ * fVar70 * auVar38._4_4_ * fVar115;
        auVar60._8_4_ = auVar27._8_4_ * fVar117 + auVar42._8_4_ * fVar70 * auVar38._8_4_ * fVar115;
        auVar60._12_4_ =
             auVar27._12_4_ * fVar118 + auVar42._12_4_ * fVar70 * auVar38._12_4_ * fVar115;
        auVar27 = vsubps_avx(auVar40,auVar60);
        auVar40 = vaddps_avx512vl(auVar29,auVar64);
        auVar92._0_4_ = fVar91 + auVar60._0_4_;
        auVar92._4_4_ = fVar90 + auVar60._4_4_;
        auVar92._8_4_ = fVar94 + auVar60._8_4_;
        auVar92._12_4_ = fVar95 + auVar60._12_4_;
        auVar30 = vbroadcastss_avx512vl(ZEXT416(0x3eaaaaab));
        auVar26 = vmulps_avx512vl(auVar26,auVar30);
        fVar70 = auVar39._0_4_;
        fVar58 = fVar70 + auVar26._0_4_;
        auVar27 = vmulps_avx512vl(auVar27,auVar30);
        auVar27 = vsubps_avx(auVar41,auVar27);
        auVar79._4_4_ = fVar70;
        auVar79._0_4_ = fVar70;
        auVar79._8_4_ = fVar70;
        auVar79._12_4_ = fVar70;
        auVar79._16_4_ = fVar70;
        auVar79._20_4_ = fVar70;
        auVar79._24_4_ = fVar70;
        auVar79._28_4_ = fVar70;
        auVar85._8_4_ = 1;
        auVar85._0_8_ = 0x100000001;
        auVar85._12_4_ = 1;
        auVar85._16_4_ = 1;
        auVar85._20_4_ = 1;
        auVar85._24_4_ = 1;
        auVar85._28_4_ = 1;
        auVar54 = vpermps_avx2(auVar85,ZEXT1632(auVar39));
        auVar97._8_4_ = 2;
        auVar97._0_8_ = 0x200000002;
        auVar97._12_4_ = 2;
        auVar97._16_4_ = 2;
        auVar97._20_4_ = 2;
        auVar97._24_4_ = 2;
        auVar97._28_4_ = 2;
        auVar53 = vpermps_avx2(auVar97,ZEXT1632(auVar39));
        auVar106._4_4_ = fVar58;
        auVar106._0_4_ = fVar58;
        auVar106._8_4_ = fVar58;
        auVar106._12_4_ = fVar58;
        auVar106._16_4_ = fVar58;
        auVar106._20_4_ = fVar58;
        auVar106._24_4_ = fVar58;
        auVar106._28_4_ = fVar58;
        auVar44 = ZEXT1632(CONCAT412(auVar39._12_4_ + auVar26._12_4_,
                                     CONCAT48(auVar39._8_4_ + auVar26._8_4_,
                                              CONCAT44(auVar39._4_4_ + auVar26._4_4_,fVar58))));
        auVar52 = vpermps_avx2(auVar85,auVar44);
        auVar44 = vpermps_avx2(auVar97,auVar44);
        uVar62 = auVar27._0_4_;
        auVar116._4_4_ = uVar62;
        auVar116._0_4_ = uVar62;
        auVar116._8_4_ = uVar62;
        auVar116._12_4_ = uVar62;
        auVar116._16_4_ = uVar62;
        auVar116._20_4_ = uVar62;
        auVar116._24_4_ = uVar62;
        auVar116._28_4_ = uVar62;
        auVar46 = vpermps_avx512vl(auVar85,ZEXT1632(auVar27));
        auVar47 = vpermps_avx512vl(auVar97,ZEXT1632(auVar27));
        auVar43 = vbroadcastss_avx512vl(auVar41);
        auVar48 = vpermps_avx512vl(auVar85,ZEXT1632(auVar41));
        auVar45 = vpermps_avx2(auVar97,ZEXT1632(auVar41));
        auVar49 = vmulps_avx512vl(auVar43,bezier_basis0._3944_32_);
        auVar50 = vmulps_avx512vl(auVar48,bezier_basis0._3944_32_);
        auVar51 = vmulps_avx512vl(auVar45,bezier_basis0._3944_32_);
        auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._2788_32_,auVar116);
        auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._2788_32_,auVar46);
        auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._2788_32_,auVar47);
        auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._1632_32_,auVar106);
        auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._1632_32_,auVar52);
        auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._1632_32_,auVar44);
        auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar79);
        auVar50 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._476_32_,auVar54);
        auVar51 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._476_32_,auVar53);
        auVar43 = vmulps_avx512vl(auVar43,bezier_basis0._8568_32_);
        auVar55 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar116);
        auVar43 = vmulps_avx512vl(auVar48,bezier_basis0._8568_32_);
        auVar46 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar46);
        fVar58 = bezier_basis0._8568_4_;
        fVar70 = bezier_basis0._8572_4_;
        auVar43._4_4_ = auVar45._4_4_ * fVar70;
        auVar43._0_4_ = auVar45._0_4_ * fVar58;
        fVar15 = bezier_basis0._8576_4_;
        auVar43._8_4_ = auVar45._8_4_ * fVar15;
        fVar115 = bezier_basis0._8580_4_;
        auVar43._12_4_ = auVar45._12_4_ * fVar115;
        fVar91 = bezier_basis0._8584_4_;
        auVar43._16_4_ = auVar45._16_4_ * fVar91;
        fVar90 = bezier_basis0._8588_4_;
        auVar43._20_4_ = auVar45._20_4_ * fVar90;
        fVar94 = bezier_basis0._8592_4_;
        auVar43._24_4_ = auVar45._24_4_ * fVar94;
        auVar43._28_4_ = auVar45._28_4_;
        auVar45 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._7412_32_,auVar47);
        auVar43 = vfmadd231ps_avx512vl(auVar55,bezier_basis0._6256_32_,auVar106);
        auVar52 = vfmadd231ps_avx512vl(auVar46,bezier_basis0._6256_32_,auVar52);
        auVar44 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._6256_32_,auVar44);
        auVar45 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._5100_32_,auVar79);
        auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._5100_32_,auVar54);
        auVar53 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._5100_32_,auVar53);
        auVar69._8_4_ = 0x3d638e39;
        auVar69._0_8_ = 0x3d638e393d638e39;
        auVar69._12_4_ = 0x3d638e39;
        auVar69._16_4_ = 0x3d638e39;
        auVar69._20_4_ = 0x3d638e39;
        auVar69._24_4_ = 0x3d638e39;
        auVar69._28_4_ = 0x3d638e39;
        auVar45 = vmulps_avx512vl(auVar45,auVar69);
        auVar47._4_4_ = auVar52._4_4_ * 0.055555556;
        auVar47._0_4_ = auVar52._0_4_ * 0.055555556;
        auVar47._8_4_ = auVar52._8_4_ * 0.055555556;
        auVar47._12_4_ = auVar52._12_4_ * 0.055555556;
        auVar47._16_4_ = auVar52._16_4_ * 0.055555556;
        auVar47._20_4_ = auVar52._20_4_ * 0.055555556;
        auVar47._24_4_ = auVar52._24_4_ * 0.055555556;
        auVar47._28_4_ = auVar54._28_4_;
        auVar48._4_4_ = auVar53._4_4_ * 0.055555556;
        auVar48._0_4_ = auVar53._0_4_ * 0.055555556;
        auVar48._8_4_ = auVar53._8_4_ * 0.055555556;
        auVar48._12_4_ = auVar53._12_4_ * 0.055555556;
        auVar48._16_4_ = auVar53._16_4_ * 0.055555556;
        auVar48._20_4_ = auVar53._20_4_ * 0.055555556;
        auVar48._24_4_ = auVar53._24_4_ * 0.055555556;
        auVar48._28_4_ = auVar53._28_4_;
        auVar41 = ZEXT416(0) << 0x40;
        auVar54 = vblendps_avx(auVar45,ZEXT1632(auVar41),1);
        auVar53 = vblendps_avx(auVar47,ZEXT1632(auVar41),1);
        auVar55 = ZEXT1632(auVar41);
        auVar52 = vblendps_avx(auVar48,auVar55,1);
        auVar44 = vsubps_avx(auVar49,auVar54);
        auVar46 = vsubps_avx512vl(auVar50,auVar53);
        auVar43 = vsubps_avx512vl(auVar51,auVar52);
        auVar54 = vblendps_avx(auVar45,auVar55,0x80);
        auVar53 = vblendps_avx(auVar47,auVar55,0x80);
        auVar52 = vblendps_avx(auVar48,auVar55,0x80);
        auVar80._0_4_ = auVar49._0_4_ + auVar54._0_4_;
        auVar80._4_4_ = auVar49._4_4_ + auVar54._4_4_;
        auVar80._8_4_ = auVar49._8_4_ + auVar54._8_4_;
        auVar80._12_4_ = auVar49._12_4_ + auVar54._12_4_;
        auVar80._16_4_ = auVar49._16_4_ + auVar54._16_4_;
        auVar80._20_4_ = auVar49._20_4_ + auVar54._20_4_;
        auVar80._24_4_ = auVar49._24_4_ + auVar54._24_4_;
        auVar80._28_4_ = auVar49._28_4_ + auVar54._28_4_;
        auVar53 = vaddps_avx512vl(auVar50,auVar53);
        auVar52 = vaddps_avx512vl(auVar51,auVar52);
        auVar48 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar54 = vminps_avx512vl(auVar48,auVar49);
        auVar45 = vminps_avx512vl(auVar48,auVar50);
        auVar47 = vminps_avx512vl(auVar48,auVar51);
        auVar55 = vminps_avx512vl(auVar44,auVar80);
        auVar55 = vminps_avx512vl(auVar54,auVar55);
        auVar54 = vminps_avx512vl(auVar46,auVar53);
        auVar56 = vminps_avx512vl(auVar45,auVar54);
        auVar54 = vminps_avx512vl(auVar43,auVar52);
        auVar47 = vminps_avx512vl(auVar47,auVar54);
        auVar54 = vmaxps_avx(auVar44,auVar80);
        auVar57 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar44 = vmaxps_avx512vl(auVar57,auVar49);
        auVar54 = vmaxps_avx(auVar44,auVar54);
        auVar53 = vmaxps_avx(auVar46,auVar53);
        auVar44 = vmaxps_avx512vl(auVar57,auVar50);
        auVar53 = vmaxps_avx(auVar44,auVar53);
        auVar27 = vmulps_avx512vl(auVar92,auVar30);
        auVar39 = vsubps_avx512vl(auVar40,auVar27);
        auVar44 = vmaxps_avx512vl(auVar57,auVar51);
        auVar52 = vmaxps_avx(auVar43,auVar52);
        auVar52 = vmaxps_avx(auVar44,auVar52);
        auVar44 = vshufps_avx(auVar55,auVar55,0xb1);
        auVar44 = vminps_avx(auVar55,auVar44);
        auVar45 = vshufpd_avx(auVar44,auVar44,5);
        auVar44 = vminps_avx(auVar44,auVar45);
        auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
        auVar44 = vshufps_avx(auVar56,auVar56,0xb1);
        auVar44 = vminps_avx(auVar56,auVar44);
        auVar45 = vshufpd_avx(auVar44,auVar44,5);
        auVar44 = vminps_avx(auVar44,auVar45);
        auVar26 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
        auVar26 = vunpcklps_avx(auVar27,auVar26);
        auVar44 = vshufps_avx512vl(auVar47,auVar47,0xb1);
        auVar45 = vminps_avx512vl(auVar47,auVar44);
        auVar44 = vshufpd_avx(auVar45,auVar45,5);
        auVar44 = vminps_avx(auVar45,auVar44);
        auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
        auVar42 = vinsertps_avx512f(auVar26,auVar27,0x28);
        auVar44 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vmaxps_avx(auVar54,auVar44);
        auVar44 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar44);
        auVar27 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar54 = vshufps_avx(auVar53,auVar53,0xb1);
        auVar54 = vmaxps_avx(auVar53,auVar54);
        auVar53 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar53);
        auVar26 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar26 = vunpcklps_avx(auVar27,auVar26);
        auVar54 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar54 = vmaxps_avx(auVar52,auVar54);
        auVar53 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar53);
        auVar27 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar38 = vinsertps_avx512f(auVar26,auVar27,0x28);
        uVar62 = auVar39._0_4_;
        auVar77._4_4_ = uVar62;
        auVar77._0_4_ = uVar62;
        auVar77._8_4_ = uVar62;
        auVar77._12_4_ = uVar62;
        auVar77._16_4_ = uVar62;
        auVar77._20_4_ = uVar62;
        auVar77._24_4_ = uVar62;
        auVar77._28_4_ = uVar62;
        auVar54 = vpermps_avx2(auVar85,ZEXT1632(auVar39));
        auVar53 = vpermps_avx2(auVar97,ZEXT1632(auVar39));
        auVar45 = vbroadcastss_avx512vl(auVar40);
        auVar46 = vpermps_avx512vl(auVar85,ZEXT1632(auVar40));
        auVar43 = vpermps_avx512vl(auVar97,ZEXT1632(auVar40));
        auVar44 = vmulps_avx512vl(auVar45,bezier_basis0._3944_32_);
        auVar93._0_4_ = auVar46._0_4_ * bezier_basis0._3944_4_;
        auVar93._4_4_ = auVar46._4_4_ * bezier_basis0._3948_4_;
        auVar93._8_4_ = auVar46._8_4_ * bezier_basis0._3952_4_;
        auVar93._12_4_ = auVar46._12_4_ * bezier_basis0._3956_4_;
        auVar93._16_4_ = auVar46._16_4_ * bezier_basis0._3960_4_;
        auVar93._20_4_ = auVar46._20_4_ * bezier_basis0._3964_4_;
        auVar93._24_4_ = auVar46._24_4_ * bezier_basis0._3968_4_;
        auVar93._28_4_ = 0;
        auVar52._4_4_ = auVar43._4_4_ * bezier_basis0._3948_4_;
        auVar52._0_4_ = auVar43._0_4_ * bezier_basis0._3944_4_;
        auVar52._8_4_ = auVar43._8_4_ * bezier_basis0._3952_4_;
        auVar52._12_4_ = auVar43._12_4_ * bezier_basis0._3956_4_;
        auVar52._16_4_ = auVar43._16_4_ * bezier_basis0._3960_4_;
        auVar52._20_4_ = auVar43._20_4_ * bezier_basis0._3964_4_;
        auVar52._24_4_ = auVar43._24_4_ * bezier_basis0._3968_4_;
        auVar52._28_4_ = bezier_basis0._3972_4_;
        auVar47 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._2788_32_,auVar77);
        auVar51 = vfmadd231ps_avx512vl(auVar93,bezier_basis0._2788_32_,auVar54);
        auVar52 = vfmadd231ps_avx512vl(auVar52,auVar53,bezier_basis0._2788_32_);
        auVar44._4_4_ = auVar45._4_4_ * fVar70;
        auVar44._0_4_ = auVar45._0_4_ * fVar58;
        auVar44._8_4_ = auVar45._8_4_ * fVar15;
        auVar44._12_4_ = auVar45._12_4_ * fVar115;
        auVar44._16_4_ = auVar45._16_4_ * fVar91;
        auVar44._20_4_ = auVar45._20_4_ * fVar90;
        auVar44._24_4_ = auVar45._24_4_ * fVar94;
        auVar44._28_4_ = auVar45._28_4_;
        auVar49._4_4_ = auVar46._4_4_ * fVar70;
        auVar49._0_4_ = auVar46._0_4_ * fVar58;
        auVar49._8_4_ = auVar46._8_4_ * fVar15;
        auVar49._12_4_ = auVar46._12_4_ * fVar115;
        auVar49._16_4_ = auVar46._16_4_ * fVar91;
        auVar49._20_4_ = auVar46._20_4_ * fVar90;
        auVar49._24_4_ = auVar46._24_4_ * fVar94;
        auVar49._28_4_ = auVar46._28_4_;
        auVar50._4_4_ = auVar43._4_4_ * fVar70;
        auVar50._0_4_ = auVar43._0_4_ * fVar58;
        auVar50._8_4_ = auVar43._8_4_ * fVar15;
        auVar50._12_4_ = auVar43._12_4_ * fVar115;
        auVar50._16_4_ = auVar43._16_4_ * fVar91;
        auVar50._20_4_ = auVar43._20_4_ * fVar90;
        auVar50._24_4_ = auVar43._24_4_ * fVar94;
        auVar50._28_4_ = bezier_basis0._8596_4_;
        auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._7412_32_,auVar77);
        auVar33._4_4_ = fVar12 + auVar73._4_4_;
        auVar33._0_4_ = fVar104 + auVar73._0_4_;
        auVar33._8_4_ = fVar13 + auVar73._8_4_;
        auVar33._12_4_ = fVar14 + auVar73._12_4_;
        auVar27 = vmulps_avx512vl(auVar30,auVar33);
        auVar27 = vaddps_avx512vl(auVar37,auVar27);
        auVar45 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._7412_32_,auVar54);
        auVar46 = vbroadcastss_avx512vl(auVar37);
        auVar43 = vfmadd231ps_avx512vl(auVar50,bezier_basis0._7412_32_,auVar53);
        uVar62 = auVar27._0_4_;
        auVar83._4_4_ = uVar62;
        auVar83._0_4_ = uVar62;
        auVar83._8_4_ = uVar62;
        auVar83._12_4_ = uVar62;
        auVar83._16_4_ = uVar62;
        auVar83._20_4_ = uVar62;
        auVar83._24_4_ = uVar62;
        auVar83._28_4_ = uVar62;
        auVar54 = vpermps_avx2(auVar85,ZEXT1632(auVar27));
        auVar53 = vpermps_avx2(auVar97,ZEXT1632(auVar27));
        auVar47 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._1632_32_,auVar83);
        auVar49 = vfmadd231ps_avx512vl(auVar51,bezier_basis0._1632_32_,auVar54);
        auVar52 = vfmadd231ps_avx512vl(auVar52,auVar53,bezier_basis0._1632_32_);
        auVar50 = vpermps_avx512vl(auVar85,ZEXT1632(auVar37));
        auVar51 = vpermps_avx512vl(auVar97,ZEXT1632(auVar37));
        auVar55 = vfmadd231ps_avx512vl(auVar47,bezier_basis0._476_32_,auVar46);
        auVar49 = vfmadd231ps_avx512vl(auVar49,bezier_basis0._476_32_,auVar50);
        auVar56 = vfmadd231ps_avx512vl(auVar52,auVar51,bezier_basis0._476_32_);
        auVar52 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._6256_32_,auVar83);
        auVar54 = vfmadd231ps_avx512vl(auVar45,bezier_basis0._6256_32_,auVar54);
        auVar44 = vfmadd231ps_avx512vl(auVar43,bezier_basis0._6256_32_,auVar53);
        auVar52 = vfmadd231ps_avx512vl(auVar52,bezier_basis0._5100_32_,auVar46);
        auVar54 = vfmadd231ps_avx512vl(auVar54,bezier_basis0._5100_32_,auVar50);
        auVar44 = vfmadd231ps_avx512vl(auVar44,bezier_basis0._5100_32_,auVar51);
        auVar51._4_4_ = auVar52._4_4_ * 0.055555556;
        auVar51._0_4_ = auVar52._0_4_ * 0.055555556;
        auVar51._8_4_ = auVar52._8_4_ * 0.055555556;
        auVar51._12_4_ = auVar52._12_4_ * 0.055555556;
        auVar51._16_4_ = auVar52._16_4_ * 0.055555556;
        auVar51._20_4_ = auVar52._20_4_ * 0.055555556;
        auVar51._24_4_ = auVar52._24_4_ * 0.055555556;
        auVar51._28_4_ = auVar53._28_4_;
        auVar18._4_4_ = auVar54._4_4_ * 0.055555556;
        auVar18._0_4_ = auVar54._0_4_ * 0.055555556;
        auVar18._8_4_ = auVar54._8_4_ * 0.055555556;
        auVar18._12_4_ = auVar54._12_4_ * 0.055555556;
        auVar18._16_4_ = auVar54._16_4_ * 0.055555556;
        auVar18._20_4_ = auVar54._20_4_ * 0.055555556;
        auVar18._24_4_ = auVar54._24_4_ * 0.055555556;
        auVar18._28_4_ = auVar46._28_4_;
        auVar19._4_4_ = auVar44._4_4_ * 0.055555556;
        auVar19._0_4_ = auVar44._0_4_ * 0.055555556;
        auVar19._8_4_ = auVar44._8_4_ * 0.055555556;
        auVar19._12_4_ = auVar44._12_4_ * 0.055555556;
        auVar19._16_4_ = auVar44._16_4_ * 0.055555556;
        auVar19._20_4_ = auVar44._20_4_ * 0.055555556;
        auVar19._24_4_ = auVar44._24_4_ * 0.055555556;
        auVar19._28_4_ = auVar44._28_4_;
        auVar44 = ZEXT1632(auVar41);
        auVar54 = vblendps_avx(auVar51,auVar44,1);
        auVar53 = vblendps_avx(auVar18,auVar44,1);
        auVar52 = vblendps_avx(auVar19,auVar44,1);
        auVar50 = vsubps_avx512vl(auVar55,auVar54);
        auVar43 = vsubps_avx(auVar49,auVar53);
        auVar47 = vsubps_avx(auVar56,auVar52);
        auVar54 = vblendps_avx(auVar51,auVar44,0x80);
        auVar53 = vblendps_avx(auVar18,auVar44,0x80);
        auVar52 = vblendps_avx(auVar19,auVar44,0x80);
        auVar51 = vaddps_avx512vl(auVar55,auVar54);
        auVar81._0_4_ = auVar49._0_4_ + auVar53._0_4_;
        auVar81._4_4_ = auVar49._4_4_ + auVar53._4_4_;
        auVar81._8_4_ = auVar49._8_4_ + auVar53._8_4_;
        auVar81._12_4_ = auVar49._12_4_ + auVar53._12_4_;
        auVar81._16_4_ = auVar49._16_4_ + auVar53._16_4_;
        auVar81._20_4_ = auVar49._20_4_ + auVar53._20_4_;
        auVar81._24_4_ = auVar49._24_4_ + auVar53._24_4_;
        auVar81._28_4_ = auVar49._28_4_ + auVar53._28_4_;
        auVar65._0_4_ = auVar56._0_4_ + auVar52._0_4_;
        auVar65._4_4_ = auVar56._4_4_ + auVar52._4_4_;
        auVar65._8_4_ = auVar56._8_4_ + auVar52._8_4_;
        auVar65._12_4_ = auVar56._12_4_ + auVar52._12_4_;
        auVar65._16_4_ = auVar56._16_4_ + auVar52._16_4_;
        auVar65._20_4_ = auVar56._20_4_ + auVar52._20_4_;
        auVar65._24_4_ = auVar56._24_4_ + auVar52._24_4_;
        auVar65._28_4_ = auVar56._28_4_ + auVar52._28_4_;
        auVar53 = vminps_avx512vl(auVar48,auVar55);
        auVar52 = vminps_avx512vl(auVar48,auVar49);
        auVar46 = vminps_avx512vl(auVar48,auVar56);
        auVar54 = vminps_avx(auVar50,auVar51);
        auVar44 = vminps_avx(auVar53,auVar54);
        auVar54 = vminps_avx(auVar43,auVar81);
        auVar45 = vminps_avx(auVar52,auVar54);
        auVar54 = vminps_avx(auVar47,auVar65);
        auVar46 = vminps_avx(auVar46,auVar54);
        auVar54 = vmaxps_avx(auVar50,auVar51);
        auVar53 = vmaxps_avx512vl(auVar57,auVar55);
        auVar54 = vmaxps_avx(auVar53,auVar54);
        auVar53 = vmaxps_avx(auVar43,auVar81);
        auVar52 = vmaxps_avx512vl(auVar57,auVar49);
        auVar53 = vmaxps_avx(auVar52,auVar53);
        auVar52 = vmaxps_avx(auVar47,auVar65);
        auVar43 = vmaxps_avx512vl(auVar57,auVar56);
        auVar52 = vmaxps_avx(auVar43,auVar52);
        auVar43 = vshufps_avx(auVar44,auVar44,0xb1);
        auVar44 = vminps_avx(auVar44,auVar43);
        auVar43 = vshufpd_avx(auVar44,auVar44,5);
        auVar44 = vminps_avx(auVar44,auVar43);
        auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
        auVar44 = vshufps_avx(auVar45,auVar45,0xb1);
        auVar44 = vminps_avx(auVar45,auVar44);
        auVar45 = vshufpd_avx(auVar44,auVar44,5);
        auVar44 = vminps_avx(auVar44,auVar45);
        auVar26 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
        auVar26 = vunpcklps_avx(auVar27,auVar26);
        auVar44 = vshufps_avx(auVar46,auVar46,0xb1);
        auVar44 = vminps_avx(auVar46,auVar44);
        auVar45 = vshufpd_avx(auVar44,auVar44,5);
        auVar44 = vminps_avx(auVar44,auVar45);
        auVar27 = vminps_avx(auVar44._0_16_,auVar44._16_16_);
        auVar86 = ZEXT1664(CONCAT412(0x5dccb9a2,CONCAT48(0x5dccb9a2,0x5dccb9a25dccb9a2)));
        auVar27 = vinsertps_avx(auVar26,auVar27,0x28);
        auVar42 = vminps_avx512vl(auVar42,auVar27);
        auVar44 = vshufps_avx(auVar54,auVar54,0xb1);
        auVar54 = vmaxps_avx(auVar54,auVar44);
        auVar44 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar44);
        auVar27 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar54 = vshufps_avx(auVar53,auVar53,0xb1);
        auVar54 = vmaxps_avx(auVar53,auVar54);
        auVar53 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar53);
        auVar26 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar66 = ZEXT1664(CONCAT412(0xddccb9a2,CONCAT48(0xddccb9a2,0xddccb9a2ddccb9a2)));
        auVar26 = vunpcklps_avx(auVar27,auVar26);
        auVar54 = vshufps_avx(auVar52,auVar52,0xb1);
        auVar54 = vmaxps_avx(auVar52,auVar54);
        auVar53 = vshufpd_avx(auVar54,auVar54,5);
        auVar54 = vmaxps_avx(auVar54,auVar53);
        auVar27 = vmaxps_avx(auVar54._0_16_,auVar54._16_16_);
        auVar27 = vinsertps_avx(auVar26,auVar27,0x28);
        auVar38 = vmaxps_avx512vl(auVar38,auVar27);
        auVar67._8_4_ = 0x7fffffff;
        auVar67._0_8_ = 0x7fffffff7fffffff;
        auVar67._12_4_ = 0x7fffffff;
        auVar27 = vandps_avx(auVar42,auVar67);
        auVar26 = vandps_avx(auVar38,auVar67);
        auVar27 = vmaxps_avx(auVar27,auVar26);
        auVar26 = vmovshdup_avx(auVar27);
        auVar26 = vmaxss_avx(auVar26,auVar27);
        auVar27 = vshufpd_avx(auVar27,auVar27,1);
        auVar27 = vmaxss_avx(auVar27,auVar26);
        fVar58 = auVar27._0_4_ * 4.7683716e-07;
        auVar74._4_4_ = fVar58;
        auVar74._0_4_ = fVar58;
        auVar74._8_4_ = fVar58;
        auVar74._12_4_ = fVar58;
        auVar27 = vsubps_avx(auVar42,auVar74);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar27,ZEXT416(geomID),0x30);
        auVar61._0_4_ = auVar38._0_4_ + fVar58;
        auVar61._4_4_ = auVar38._4_4_ + fVar58;
        auVar61._8_4_ = auVar38._8_4_ + fVar58;
        auVar61._12_4_ = auVar38._12_4_ + fVar58;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar61,ZEXT416((uint)uVar22),0x30);
        auVar75._0_4_ = aVar10.x + aVar11.x;
        auVar75._4_4_ = aVar10.y + aVar11.y;
        auVar75._8_4_ = aVar10.z + aVar11.z;
        auVar75._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
        local_98 = vminps_avx(local_98,auVar75);
        local_a8 = vmaxps_avx(local_a8,auVar75);
        local_78 = vmaxps_avx(local_78,(undefined1  [16])aVar11);
        auVar78 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
        prims[local_b0].upper.field_0.field_1 = aVar11;
        local_88 = vminps_avx(local_88,(undefined1  [16])aVar10);
        prims[local_b0].lower.field_0.field_1 = aVar10;
        local_b8 = local_b8 + 1;
        local_b0 = local_b0 + 1;
      }
LAB_01f074c4:
      uVar22 = uVar22 + 1;
    } while (uVar22 < r->_end);
  }
  else {
    local_b8 = 0;
    local_a8._8_4_ = 0xff800000;
    local_a8._0_8_ = 0xff800000ff800000;
    local_a8._12_4_ = 0xff800000;
    local_78._8_4_ = 0xff800000;
    local_78._0_8_ = 0xff800000ff800000;
    local_78._12_4_ = 0xff800000;
    local_98._8_4_ = 0x7f800000;
    local_98._0_8_ = 0x7f8000007f800000;
    local_98._12_4_ = 0x7f800000;
    local_88._8_4_ = 0x7f800000;
    local_88._0_8_ = 0x7f8000007f800000;
    local_88._12_4_ = 0x7f800000;
  }
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0
       = local_88._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.
           field_0 + 8) = local_88._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0
       = local_78._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.
           field_0 + 8) = local_78._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0
       = local_98._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.
           field_0 + 8) = local_98._8_8_;
  *(undefined8 *)
   &(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0
       = local_a8._0_8_;
  *(undefined8 *)
   ((long)&(__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.
           field_0 + 8) = local_a8._8_8_;
  __return_storage_ptr__->end = local_b8;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }